

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O1

int converterApp_fileConversions_Test::AddToRegistry(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<converterApp> *this_01;
  TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *meta_factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"converterApp","");
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
             ,"");
  paVar2 = &local_58.file.field_2;
  if (local_e0 == &local_d0) {
    local_58.file.field_2._8_8_ = local_d0._8_8_;
    local_58.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_e0;
  }
  local_58.file.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
  local_58.file.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
  local_58.file._M_string_length = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_58.line = 0x3b;
  local_e0 = &local_d0;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<converterApp>(this_00,&local_a0,&local_58);
  meta_factory = (TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_0019d7a8;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
             ,"");
  paVar1 = &local_80.file.field_2;
  if (local_c0 == &local_b0) {
    local_80.file.field_2._8_8_ = local_b0._8_8_;
    local_80.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_80.file.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_80.file.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_80.file._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_80.line = 0x3b;
  local_c0 = &local_b0;
  testing::internal::ParameterizedTestSuiteInfo<converterApp>::AddTestPattern
            (this_01,"converterApp","fileConversions",meta_factory,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.file._M_dataplus._M_p,local_80.file.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

TEST_P(converterApp, fileConversions)
{
    std::string testFile = TEST_FILE_FOLDER "/test_conversions/";
    testFile.append(GetParam());
    testFile.append("_conversions.txt");
    loadFile(testFile);
    auto baseUnit = units::unit_from_string(unit_conv[0].name);
    double baseValue = unit_conv[0].value;
    for (auto& convcode : unit_conv) {
        auto unit = units::unit_from_string(convcode.name);
        EXPECT_FALSE(is_error(unit)) << "error converting " << convcode.name;
        if (!convcode.short_name.empty()) {
            auto unit_short = units::unit_from_string(convcode.short_name);
            EXPECT_FALSE(is_error(unit_short))
                << "error converting " << convcode.short_name;
            if (unit != unit_short) {
                if (unit == units::precise::log::bel) {
                    continue;  // this is a known choice to match SI
                }
                EXPECT_FLOAT_EQ(convert(1.0, unit, unit_short), 1.0F)
                    << convcode.short_name << " and " << convcode.name
                    << " do not match";
            } else {
                EXPECT_EQ(unit, unit_short)
                    << convcode.name << " and " << convcode.short_name
                    << " do not produce the same unit";
            }
        }
        double res = units::convert(baseValue, baseUnit, unit);
        EXPECT_NEAR(res / convcode.value, 1.0, 0.003)
            << unit_conv[0].name << " to " << convcode.name << " produced "
            << res << " when " << convcode.value << " expected";
        double return_value = units::convert(convcode.value, unit, baseUnit);
        EXPECT_NEAR(return_value / baseValue, 1.0, 0.003);
    }
}